

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O3

CURLcode Curl_build_unencoding_stack(connectdata *conn,char *enclist,int maybechunked)

{
  byte *pbVar1;
  undefined1 *puVar2;
  byte bVar3;
  Curl_easy *pCVar4;
  int iVar5;
  contenc_writer *pcVar6;
  size_t max;
  content_encoding *ce;
  content_encoding *handler;
  byte *pbVar7;
  size_t sVar8;
  content_encoding **ppcVar9;
  
  pCVar4 = conn->data;
  do {
    for (; (iVar5 = Curl_isspace((uint)(byte)*enclist), iVar5 != 0 ||
           (bVar3 = *enclist, bVar3 == 0x2c)); enclist = (char *)((byte *)enclist + 1)) {
    }
    sVar8 = 1;
    max = 0;
    pbVar7 = (byte *)enclist;
    while ((bVar3 != 0 && (bVar3 != 0x2c))) {
      iVar5 = Curl_isspace((uint)bVar3);
      if (iVar5 == 0) {
        max = sVar8;
      }
      pbVar1 = pbVar7 + 1;
      pbVar7 = pbVar7 + 1;
      sVar8 = sVar8 + 1;
      bVar3 = *pbVar1;
    }
    if ((maybechunked == 0) || (max != 7)) {
      if (max != 0) goto LAB_0012bd48;
    }
    else {
      iVar5 = Curl_strncasecompare(enclist,"chunked",7);
      if (iVar5 == 0) {
LAB_0012bd48:
        ppcVar9 = encodings;
        handler = &identity_encoding;
        do {
          ppcVar9 = ppcVar9 + 1;
          iVar5 = Curl_strncasecompare(enclist,handler->name,max);
          if (((iVar5 != 0) && (handler->name[max] == '\0')) ||
             ((handler->alias != (char *)0x0 &&
              ((iVar5 = Curl_strncasecompare(enclist,handler->alias,max), iVar5 != 0 &&
               (handler->alias[max] == '\0')))))) goto LAB_0012bda6;
          handler = *ppcVar9;
        } while (handler != (content_encoding *)0x0);
        handler = (content_encoding *)0x0;
LAB_0012bda6:
        pcVar6 = (pCVar4->req).writer_stack;
        if (pcVar6 == (contenc_writer *)0x0) {
          pcVar6 = new_unencoding_writer(conn,&client_encoding,(contenc_writer *)0x0);
          (pCVar4->req).writer_stack = pcVar6;
          if (pcVar6 == (contenc_writer *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
        }
        if (handler == (content_encoding *)0x0) {
          handler = &error_encoding;
        }
        pcVar6 = new_unencoding_writer(conn,handler,pcVar6);
        if (pcVar6 == (contenc_writer *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        (pCVar4->req).writer_stack = pcVar6;
      }
      else {
        puVar2 = &(pCVar4->req).field_0x570;
        *puVar2 = *puVar2 | 0x20;
        Curl_httpchunk_init(conn);
      }
    }
    enclist = (char *)pbVar7;
    if (*pbVar7 == 0) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

CURLcode Curl_build_unencoding_stack(struct connectdata *conn,
                                     const char *enclist, int maybechunked)
{
  struct Curl_easy *data = conn->data;
  struct SingleRequest *k = &data->req;

  do {
    const char *name;
    size_t namelen;

    /* Parse a single encoding name. */
    while(ISSPACE(*enclist) || *enclist == ',')
      enclist++;

    name = enclist;

    for(namelen = 0; *enclist && *enclist != ','; enclist++)
      if(!ISSPACE(*enclist))
        namelen = enclist - name + 1;

    /* Special case: chunked encoding is handled at the reader level. */
    if(maybechunked && namelen == 7 && strncasecompare(name, "chunked", 7)) {
      k->chunk = TRUE;             /* chunks coming our way. */
      Curl_httpchunk_init(conn);   /* init our chunky engine. */
    }
    else if(namelen) {
      const content_encoding *encoding = find_encoding(name, namelen);
      contenc_writer *writer;

      if(!k->writer_stack) {
        k->writer_stack = new_unencoding_writer(conn, &client_encoding, NULL);

        if(!k->writer_stack)
          return CURLE_OUT_OF_MEMORY;
      }

      if(!encoding)
        encoding = &error_encoding;  /* Defer error at stack use. */

      /* Stack the unencoding stage. */
      writer = new_unencoding_writer(conn, encoding, k->writer_stack);
      if(!writer)
        return CURLE_OUT_OF_MEMORY;
      k->writer_stack = writer;
    }
  } while(*enclist);

  return CURLE_OK;
}